

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

int bhitm(monst *mtmp,obj *otmp)

{
  char oclass;
  ushort otyp;
  permonst *ptr;
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  obj *poVar7;
  char *force;
  char *pcVar8;
  int tmp_1;
  int iVar9;
  int tmp_2;
  int iVar10;
  int tmp;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  char nambuf [256];
  char local_138 [264];
  
  otyp = otmp->otyp;
  iVar9 = (int)(short)otyp;
  ptr = mtmp->data;
  bVar2 = true;
  bVar1 = true;
  bVar12 = true;
  if (ptr->mlet == '\r') {
    bVar12 = mtmp->m_ap_type == '\0';
  }
  bVar11 = urole.malenum == 0x15f & (u.uhave._0_1_ & 0x10) >> 4;
  bVar13 = false;
  if (0x1bd < otyp) {
    switch(otyp) {
    case 0x1be:
      iVar9 = flash_hits_mon(mtmp,otmp);
      bVar13 = true;
      if (iVar9 != 0) {
        discover_object(0x1be,'\x01','\x01');
        goto LAB_0028e181;
      }
      bVar1 = true;
      break;
    default:
      goto switchD_0028d7df_caseD_1bf;
    case 0x1c3:
    case 0x1cd:
      break;
    case 0x1c4:
      pcVar6 = "wand";
      goto LAB_0028dd87;
    case 0x1c5:
      bVar11 = mtmp->field_0x60;
      pcVar6 = Monnam(mtmp);
      strcpy(local_138,pcVar6);
      mon_set_minvis(mtmp);
      if (((bVar11 & 2) == 0) && ((mtmp->field_0x60 & 2) != 0)) {
        if ((((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) &&
            ((((u.uprops[0xc].extrinsic != 0 || u.uprops[0xc].intrinsic != 0 ||
               (((youmonst.data)->mflags1 & 0x1000000) != 0)) || (u.uprops[0x42].intrinsic != 0)) ||
             (u.uprops[0x42].extrinsic != 0)))) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            (((u.uprops[0x19].intrinsic & 0xf8ffffff) != 0 &&
             (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar9 < 0x41)))))) {
          pline("%s turns transparent!",local_138);
          iVar9 = 0x1c5;
LAB_0028eab6:
          discover_object(iVar9,'\x01','\x01');
        }
      }
      goto LAB_0028ebc9;
    case 0x1c6:
      goto switchD_0028d7df_caseD_1c6;
    case 0x1c7:
      iVar9 = resist(mtmp,otmp->oclass,0,0);
      bVar1 = true;
      bVar13 = true;
      if (iVar9 == 0) {
        mon_adjust_speed(mtmp,1,otmp);
        m_dowear(level,mtmp,'\0');
        goto LAB_0028ebc9;
      }
      break;
    case 0x1c8:
switchD_0028d7df_caseD_1c8:
      iVar4 = unturn_dead(mtmp);
      bVar13 = iVar4 != 0;
      if ((mtmp->data->mflags2 & 2) != 0) {
        uVar5 = mt_random();
        iVar4 = (uVar5 & 7) + 1 << bVar11;
        if (iVar9 == 0x19d) {
          iVar9 = spell_damage_bonus();
          iVar4 = iVar4 + iVar9;
        }
        flags.bypasses = '\x01';
        bVar1 = false;
        iVar9 = resist(mtmp,otmp->oclass,iVar4,0);
        bVar13 = true;
        if (iVar9 == 0) {
          if (mtmp->mhp < 1) goto LAB_0028e181;
          bVar1 = false;
          monflee(mtmp,0,'\0','\x01');
        }
      }
      break;
    case 0x1c9:
      goto switchD_0028d7df_caseD_1c9;
    case 0x1ca:
switchD_0028d7df_caseD_1ca:
      cancel_monst(mtmp,otmp,'\x01','\x01','\0');
LAB_0028ebc9:
      bVar12 = true;
LAB_0028ebcc:
      bVar1 = bVar12;
      bVar13 = true;
      break;
    case 0x1cb:
switchD_0028d7df_caseD_1cb:
      bVar3 = u_teleport_mon(mtmp,'\x01');
      bVar12 = bVar3 != '\0';
      goto LAB_0028ebcc;
    case 0x1cc:
      goto switchD_0028d7df_caseD_1cc;
    case 0x1ce:
      probe_monster(mtmp);
      discover_object(0x1ce,'\x01','\x01');
LAB_0028e435:
      bVar2 = false;
      goto LAB_0028e438;
    case 0x1d3:
      iVar9 = otmp->spe + 1;
      iVar4 = iVar9;
      if (iVar9 == 0) {
        iVar9 = 0;
      }
      else {
        do {
          uVar5 = mt_random();
          iVar9 = iVar9 + uVar5 % 0xc;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      iVar9 = sleep_monst(mtmp,iVar9,0xb);
      if (iVar9 != 0) {
        slept_monst(mtmp);
      }
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_0028e181;
      iVar9 = 0x1d3;
LAB_0028e16f:
      discover_object(iVar9,'\x01','\x01');
      goto LAB_0028e181;
    }
    goto switchD_0028d7df_caseD_1c3;
  }
  switch(otyp) {
  case 0x185:
switchD_0028d83d_caseD_196:
    if (ptr != mons + 0x145) {
      iVar4 = 6;
      iVar10 = -6;
      do {
        uVar5 = mt_random();
        iVar4 = iVar4 + (uVar5 & (uint)(iVar9 == 0x196) * 4 + 3);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0);
      iVar4 = iVar4 + mtmp->mhp;
      if (mtmp->mhpmax <= iVar4) {
        iVar4 = mtmp->mhpmax;
      }
      mtmp->mhp = iVar4;
      if (mtmp->mblinded != '\0') {
        mtmp->mblinded = '\0';
        mtmp->field_0x62 = mtmp->field_0x62 | 2;
      }
      if (mtmp->wormno == '\0') {
        if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
              (((youmonst.data)->mflags3 & 0x100) != 0)) &&
             (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0)))))
            ))) goto LAB_0028e337;
      }
      else {
        bVar3 = worm_known(level,mtmp);
        if (bVar3 != '\0') {
LAB_0028e337:
          uVar5 = *(uint *)&mtmp->field_0x60;
          if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar5 & 0x280) == 0) goto LAB_0028e388;
          }
          else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028e388:
            if ((u._1052_1_ & 0x20) == 0) {
              if (bVar12) {
                pcVar6 = Monnam(mtmp);
                pcVar8 = "";
                if (iVar9 == 0x196) {
                  pcVar8 = " much";
                }
                pline("%s looks%s better.",pcVar6,pcVar8);
              }
              else if ((mtmp->m_ap_type == '\x02') && (mtmp->mappearance == 0)) {
                set_mimic_sym(mtmp,level);
                newsym((int)mtmp->mx,(int)mtmp->my);
              }
              else {
                mimic_hit_msg(mtmp,otyp);
              }
            }
          }
        }
      }
      if (mtmp->mtame == '\0') {
        bVar1 = false;
        bVar13 = false;
        if ((mtmp->field_0x62 & 0x40) == 0) break;
      }
      iVar9 = 1;
      if (urole.malenum != 0x15e) {
        iVar9 = sgn((int)u.ualign.type);
      }
      adjalign(iVar9);
      goto LAB_0028e435;
    }
    oclass = otmp->oclass;
    iVar4 = 3;
    iVar10 = -3;
    do {
      uVar5 = mt_random();
      iVar4 = iVar4 + (uVar5 & (uint)(iVar9 == 0x196) * 4 + 3);
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
    resist(mtmp,oclass,iVar4,1);
    goto LAB_0028e181;
  case 0x186:
switchD_0028d7df_caseD_1cc:
    if (((u._1052_1_ & 1) == 0) || (u.ustuck != mtmp)) {
      poVar7 = which_armor(mtmp,0x100000);
      if (poVar7 != (obj *)0x0) {
        mtmp->misc_worn_check = mtmp->misc_worn_check & ~poVar7->owornmask;
        bVar13 = false;
        update_mon_intrinsics(level,mtmp,poVar7,'\0','\0');
        poVar7->owornmask = 0;
        obj_extract_self(poVar7);
        place_object(poVar7,level,(int)mtmp->mx,(int)mtmp->my);
        newsym((int)mtmp->mx,(int)mtmp->my);
        break;
      }
    }
    else {
      if ((ptr->mflags1 & 0x40000) != 0) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pcVar6 = Monnam(mtmp);
          pline("%s opens its mouth!",pcVar6);
        }
        else {
          pline("You feel a sudden rush of air!");
        }
      }
      expels(mtmp,mtmp->data,'\x01');
    }
LAB_0028e438:
    bVar1 = bVar2;
    bVar13 = false;
    break;
  case 0x187:
    pcVar6 = "spell";
LAB_0028dd87:
    bVar3 = resists_magm(mtmp);
    if (bVar3 == '\0') {
      if ((u._1052_1_ & 1) == 0) {
        uVar5 = mt_random();
        iVar4 = find_mac(mtmp);
        if (iVar4 + 9 <= (int)(uVar5 % 0x14)) {
          miss(pcVar6,mtmp);
          goto LAB_0028e16f;
        }
      }
      iVar10 = 2;
      iVar4 = -2;
      do {
        uVar5 = mt_random();
        iVar10 = iVar10 + uVar5 % 0xc;
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0);
      iVar10 = iVar10 << bVar11;
      if (iVar9 == 0x187) {
        iVar4 = spell_damage_bonus();
        iVar10 = iVar10 + iVar4;
      }
      pcVar8 = "!";
      if (iVar10 < 5) {
        pcVar8 = ".";
      }
      force = "?";
      if (-1 < iVar10) {
        force = pcVar8;
      }
      hit(pcVar6,'\0',mtmp,force);
      resist(mtmp,otmp->oclass,iVar10,1);
      goto LAB_0028e16f;
    }
    shieldeff(mtmp->mx,mtmp->my);
LAB_0028e181:
    bVar13 = true;
    bVar1 = false;
    break;
  case 0x188:
  case 0x189:
    goto switchD_0028d7df_caseD_1bf;
  case 0x18a:
    uVar5 = mt_random();
    iVar9 = spell_damage_bonus();
    bVar3 = resists_drli(mtmp);
    if (bVar3 != '\0') {
LAB_0028dc3d:
      shieldeff(mtmp->mx,mtmp->my);
      goto LAB_0028ebc9;
    }
    iVar9 = ((uVar5 & 7) + 1 << bVar11) + iVar9;
    iVar4 = resist(mtmp,otmp->oclass,iVar9,0);
    bVar1 = true;
    bVar13 = true;
    if (iVar4 != 0) break;
    iVar4 = mtmp->mhp;
    if (iVar4 < 1) goto LAB_0028ebc9;
    iVar10 = mtmp->mhpmax - iVar9;
    mtmp->mhp = iVar4 - iVar9;
    mtmp->mhpmax = iVar10;
    if ((0 < iVar10 && (iVar4 - iVar9 != 0 && iVar9 <= iVar4)) && (mtmp->m_lev != '\0')) {
      mtmp->m_lev = mtmp->m_lev + 0xff;
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          if ((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
            if (ublindf == (obj *)0x0) goto LAB_0028ebc9;
            bVar1 = true;
            bVar13 = true;
            if (ublindf->oartifact != '\x1d') break;
          }
          if (u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) {
            bVar1 = true;
            bVar13 = true;
            if (((youmonst.data)->mflags3 & 0x100) == 0) break;
          }
          bVar1 = true;
          bVar12 = true;
          if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) goto LAB_0028ebcc;
          bVar13 = true;
          if ((mtmp->data->mflags3 & 0x200) == 0) break;
        }
      }
      else {
        bVar3 = worm_known(level,mtmp);
        if (bVar3 == '\0') goto LAB_0028ebc9;
      }
      uVar5 = *(uint *)&mtmp->field_0x60;
      if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        bVar1 = true;
        bVar13 = true;
        if ((uVar5 & 0x280) == 0) {
LAB_0028efb1:
          bVar1 = true;
          bVar13 = true;
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar6 = Monnam(mtmp);
            pcVar8 = "%s suddenly seems weaker!";
            goto LAB_0028e845;
          }
        }
      }
      else {
        bVar1 = true;
        bVar12 = true;
        if ((uVar5 & 0x280) != 0) goto LAB_0028ebcc;
        bVar13 = true;
        if (((youmonst.data)->mflags1 & 0x1000000) != 0) goto LAB_0028efb1;
      }
      break;
    }
    iVar9 = 1;
LAB_0028ebc4:
    xkilled(mtmp,iVar9);
    goto LAB_0028ebc9;
  case 0x18b:
switchD_0028d7df_caseD_1c6:
    iVar9 = resist(mtmp,otmp->oclass,0,0);
    bVar1 = true;
    bVar13 = true;
    if (iVar9 == 0) {
      mon_adjust_speed(mtmp,-1,otmp);
      m_dowear(level,mtmp,'\0');
      bVar1 = true;
      bVar12 = true;
      if ((u._1052_1_ & 1) == 0) goto LAB_0028ebcc;
      bVar13 = true;
      if (u.ustuck == mtmp) {
        bVar1 = true;
        bVar13 = true;
        if (mtmp->data == mons + 0x9f || mtmp->data->mlet == '\x16') {
          pcVar6 = mon_nam(mtmp);
          pline("You disrupt %s!",pcVar6);
          pline("A huge hole opens up...");
          expels(mtmp,mtmp->data,'\x01');
          goto LAB_0028ebc9;
        }
      }
    }
    break;
  case 0x18c:
    break;
  default:
    switch(otyp) {
    case 0x196:
      goto switchD_0028d83d_caseD_196;
    case 0x197:
    case 0x198:
    case 0x199:
    case 0x19a:
    case 0x19b:
    case 0x19c:
    case 0x1a0:
    case 0x1a2:
    case 0x1a3:
      break;
    case 0x19d:
      goto switchD_0028d7df_caseD_1c8;
    case 0x19e:
switchD_0028d7df_caseD_1c9:
      bVar3 = resists_magm(mtmp);
      if (bVar3 != '\0') goto LAB_0028dc3d;
      iVar4 = resist(mtmp,otmp->oclass,0,0);
      bVar1 = true;
      bVar13 = true;
      if (iVar4 != 0) goto switchD_0028d7df_caseD_1c3;
      if (((mtmp->field_0x60 & 0x70) != 0) || (uVar5 = mt_random(), 0xa3d70a3 < uVar5 * -0x3d70a3d7)
         ) {
        iVar4 = newcham(level,mtmp,(permonst *)0x0,iVar9 != 0x13a,'\0');
        if (iVar4 == 0) goto LAB_0028ebc9;
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          bVar1 = true;
          bVar13 = true;
          if (u.umonnum == u.umonster) goto switchD_0028d7df_caseD_1c3;
          bVar3 = dmgtype(youmonst.data,0x24);
          if (bVar3 == '\0') goto LAB_0028ebc9;
        }
        if (mtmp->wormno == '\0') {
          if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
             ((((u.uprops[0x1e].intrinsic == 0 &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)) &&
               (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0)))
               ))))) goto LAB_0028e914;
        }
        else {
          bVar3 = worm_known(level,mtmp);
          if (bVar3 != '\0') {
LAB_0028e914:
            uVar5 = *(uint *)&mtmp->field_0x60;
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar5 & 0x280) == 0) goto LAB_0028e955;
            }
            else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028e955:
              if ((u._1052_1_ & 0x20) == 0) goto LAB_0028eab6;
            }
          }
        }
        if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar7 = which_armor(mtmp,4), poVar7 == (obj *)0x0 ||
              (poVar7 = which_armor(mtmp,4), poVar7->otyp != 0x4f)))) &&
            ((((u.uprops[0x1e].intrinsic != 0 ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
              (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
               ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
             (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
              (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)))))) ||
           (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
            (bVar3 = match_warn_of_mon(mtmp), bVar3 != '\0')))) goto LAB_0028eab6;
        goto LAB_0028ebc9;
      }
      if (mtmp->wormno == '\0') {
        if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
           ((((((u.uprops[0x1e].intrinsic == 0 &&
                ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
             ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
              (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
            (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))))
        goto LAB_0028eb34;
      }
      else {
        bVar3 = worm_known(level,mtmp);
        if (bVar3 != '\0') {
LAB_0028eb34:
          uVar5 = *(uint *)&mtmp->field_0x60;
          if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar5 & 0x280) == 0) goto LAB_0028eb73;
          }
          else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028eb73:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar6 = Monnam(mtmp);
              pline("%s shudders!",pcVar6);
              discover_object(iVar9,'\x01','\x01');
            }
          }
        }
      }
      for (poVar7 = mtmp->minvent; poVar7 != (obj *)0x0; poVar7 = poVar7->nobj) {
        bypass_obj(poVar7);
      }
      iVar9 = 3;
      goto LAB_0028ebc4;
    case 0x19f:
      goto switchD_0028d7df_caseD_1cb;
    case 0x1a1:
      goto switchD_0028d7df_caseD_1ca;
    case 0x1a4:
      iVar9 = monsndx(ptr);
      if (iVar9 == 0x108) {
        pcVar6 = Monnam(mtmp);
        iVar9 = newcham(level,mtmp,mons + 0x106,'\0','\0');
        if (iVar9 == 0) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if ((u.uprops[0x1e].intrinsic != 0) ||
                 (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                  (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
                if (ublindf == (obj *)0x0) goto LAB_0028ebc9;
                bVar1 = true;
                bVar13 = true;
                if (ublindf->oartifact != '\x1d') goto switchD_0028d7df_caseD_1c3;
              }
              if (u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) {
                bVar1 = true;
                bVar13 = true;
                if (((youmonst.data)->mflags3 & 0x100) == 0) goto switchD_0028d7df_caseD_1c3;
              }
              bVar1 = true;
              bVar12 = true;
              if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) goto LAB_0028ebcc;
              bVar13 = true;
              if ((mtmp->data->mflags3 & 0x200) == 0) goto switchD_0028d7df_caseD_1c3;
            }
          }
          else {
            bVar3 = worm_known(level,mtmp);
            if (bVar3 == '\0') goto LAB_0028ebc9;
          }
          uVar5 = *(uint *)&mtmp->field_0x60;
          if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            bVar1 = true;
            bVar13 = true;
            if ((uVar5 & 0x280) == 0) {
LAB_0028e821:
              bVar1 = true;
              bVar13 = true;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar8 = "%s looks rather fleshy for a moment.";
                goto LAB_0028e845;
              }
            }
          }
          else {
            bVar1 = true;
            bVar12 = true;
            if ((uVar5 & 0x280) != 0) goto LAB_0028ebcc;
            bVar13 = true;
            if (((youmonst.data)->mflags1 & 0x1000000) != 0) goto LAB_0028e821;
          }
        }
        else {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if (((u.uprops[0x1e].intrinsic != 0) ||
                  ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)) {
                if (ublindf == (obj *)0x0) goto LAB_0028ebc9;
                bVar1 = true;
                bVar13 = true;
                if (ublindf->oartifact != '\x1d') goto switchD_0028d7df_caseD_1c3;
              }
              if (u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) {
                bVar1 = true;
                bVar13 = true;
                if (((youmonst.data)->mflags3 & 0x100) == 0) goto switchD_0028d7df_caseD_1c3;
              }
              bVar1 = true;
              bVar12 = true;
              if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) goto LAB_0028ebcc;
              bVar13 = true;
              if ((mtmp->data->mflags3 & 0x200) == 0) goto switchD_0028d7df_caseD_1c3;
            }
          }
          else {
            bVar3 = worm_known(level,mtmp);
            if (bVar3 == '\0') goto LAB_0028ebc9;
          }
          uVar5 = *(uint *)&mtmp->field_0x60;
          if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            bVar1 = true;
            bVar13 = true;
            if ((uVar5 & 0x280) == 0) {
LAB_0028e697:
              bVar1 = true;
              bVar13 = true;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar8 = "%s turns to flesh!";
LAB_0028e845:
                pline(pcVar8,pcVar6);
                goto LAB_0028ebc9;
              }
            }
          }
          else {
            bVar1 = true;
            bVar12 = true;
            if ((uVar5 & 0x280) != 0) goto LAB_0028ebcc;
            bVar13 = true;
            if (((youmonst.data)->mflags1 & 0x1000000) != 0) goto LAB_0028e697;
          }
        }
        goto switchD_0028d7df_caseD_1c3;
      }
      goto LAB_0028e438;
    default:
      if (otyp == 0x13a) goto switchD_0028d7df_caseD_1c9;
    }
    goto switchD_0028d7df_caseD_1bf;
  }
switchD_0028d7df_caseD_1c3:
  if (bVar13) {
    if (mtmp->mhp < 1) {
      if (mtmp->m_ap_type != '\0') {
        seemimic(mtmp);
      }
    }
    else {
      wakeup(mtmp);
      m_respond(mtmp);
      if (((mtmp->field_0x63 & 2) != 0) && (u.ushops[0] == '\0')) {
        hot_pursuit(mtmp);
      }
    }
  }
  if (bVar1) {
    return 0;
  }
  if (mtmp->mhp < 1) {
    return 0;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))
    goto LAB_0028ed65;
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 == '\0') goto LAB_0028ed65;
  }
  uVar5 = *(uint *)&mtmp->field_0x60;
  if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar5 & 0x280) != 0) goto LAB_0028ed65;
  }
  else if (((uVar5 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_0028ed65;
  if ((u._1052_1_ & 0x20) == 0) {
    return 0;
  }
LAB_0028ed65:
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
        (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar9 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar9)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) {
    map_invisible(bhitpos.x,bhitpos.y);
  }
  return 0;
switchD_0028d7df_caseD_1bf:
  warning("What an interesting effect (%d)");
  goto LAB_0028ebc9;
}

Assistant:

int bhitm(struct monst *mtmp, struct obj *otmp)
{
	boolean wake = TRUE;	/* Most 'zaps' should wake monster */
	boolean reveal_invis = FALSE;
	boolean dbldam = Role_if (PM_KNIGHT) && u.uhave.questart;
	int dmg, otyp = otmp->otyp;
	const char *zap_type_text = "spell";
	struct obj *obj;
	boolean disguised_mimic = (mtmp->data->mlet == S_MIMIC &&
				   mtmp->m_ap_type != M_AP_NOTHING);

	if (u.uswallow && mtmp == u.ustuck)
	    reveal_invis = FALSE;

	switch(otyp) {
	case WAN_STRIKING:
		zap_type_text = "wand";
		/* fall through */
	case SPE_FORCE_BOLT:
		reveal_invis = TRUE;
		if (resists_magm(mtmp)) {	/* match effect on player */
			shieldeff(mtmp->mx, mtmp->my);
			break;	/* skip makeknown */
		} else if (u.uswallow || rnd(20) < 10 + find_mac(mtmp)) {
			dmg = dice(2,12);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_FORCE_BOLT)
			    dmg += spell_damage_bonus();
			hit(zap_type_text, FALSE, mtmp, exclam(dmg));
			resist(mtmp, otmp->oclass, dmg, TELL);
		} else miss(zap_type_text, mtmp);
		makeknown(otyp);
		break;
	case WAN_SLOW_MONSTER:
	case SPE_SLOW_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, -1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
			if (u.uswallow && (mtmp == u.ustuck) &&
			    is_whirly(mtmp->data)) {
				pline("You disrupt %s!", mon_nam(mtmp));
				pline("A huge hole opens up...");
				expels(mtmp, mtmp->data, TRUE);
			}
		}
		break;
	case WAN_SPEED_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, 1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
		}
		break;
	case WAN_UNDEAD_TURNING:
	case SPE_TURN_UNDEAD:
		wake = FALSE;
		if (unturn_dead(mtmp)) wake = TRUE;
		if (is_undead(mtmp->data)) {
			reveal_invis = TRUE;
			wake = TRUE;
			dmg = rnd(8);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_TURN_UNDEAD)
				dmg += spell_damage_bonus();
			flags.bypasses = TRUE;	/* for make_corpse() */
			if (!resist(mtmp, otmp->oclass, dmg, NOTELL)) {
			    if (mtmp->mhp > 0) monflee(mtmp, 0, FALSE, TRUE);
			}
		}
		break;
	case WAN_POLYMORPH:
	case SPE_POLYMORPH:
	case POT_POLYMORPH:
		if (resists_magm(mtmp)) {
		    /* magic resistance protects from polymorph traps, so make
		       it guard against involuntary polymorph attacks too... */
		    shieldeff(mtmp->mx, mtmp->my);
		} else if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
		    /* natural shapechangers aren't affected by system shock
		       (unless protection from shapechangers is interfering
		       with their metabolism...) */
		    if (mtmp->cham == CHAM_ORDINARY && !rn2(25)) {
			if (canseemon(level, mtmp)) {
			    pline("%s shudders!", Monnam(mtmp));
			    makeknown(otyp);
			}
			/* dropped inventory shouldn't be hit by this zap */
			for (obj = mtmp->minvent; obj; obj = obj->nobj)
			    bypass_obj(obj);
			/* flags.bypasses = TRUE; ## for make_corpse() */
			/* no corpse after system shock */
			xkilled(mtmp, 3);
		    } else if (newcham(level, mtmp, NULL,
				       (otyp != POT_POLYMORPH), FALSE)) {
			if (!Hallucination && canspotmon(level, mtmp))
			    makeknown(otyp);
		    }
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, TRUE, TRUE, FALSE);
		break;
	case WAN_TELEPORTATION:
	case SPE_TELEPORT_AWAY:
		reveal_invis = !u_teleport_mon(mtmp, TRUE);
		break;
	case WAN_MAKE_INVISIBLE:
	    {
		int oldinvis = mtmp->minvis;
		char nambuf[BUFSZ];

		/* format monster's name before altering its visibility */
		strcpy(nambuf, Monnam(mtmp));
		mon_set_minvis(mtmp);
		if (!oldinvis && knowninvisible(mtmp)) {
		    pline("%s turns transparent!", nambuf);
		    makeknown(otyp);
		}
		break;
	    }
	case WAN_NOTHING:
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
		wake = FALSE;
		break;
	case WAN_PROBING:
		wake = FALSE;
		reveal_invis = TRUE;
		probe_monster(mtmp);
		makeknown(otyp);
		break;
	case WAN_OPENING:
	case SPE_KNOCK:
		wake = FALSE;	/* don't want immediate counterattack */
		if (u.uswallow && mtmp == u.ustuck) {
			if (is_animal(mtmp->data)) {
				if (Blind) pline("You feel a sudden rush of air!");
				else pline("%s opens its mouth!", Monnam(mtmp));
			}
			expels(mtmp, mtmp->data, TRUE);
		} else if (!!(obj = which_armor(mtmp, W_SADDLE))) {
			mtmp->misc_worn_check &= ~obj->owornmask;
			update_mon_intrinsics(level, mtmp, obj, FALSE, FALSE);
			obj->owornmask = 0L;
			obj_extract_self(obj);
			place_object(obj, level, mtmp->mx, mtmp->my);
			/* call stackobj() if we ever drop anything that can merge */
			newsym(mtmp->mx, mtmp->my);
		}
		break;
	case SPE_HEALING:
	case SPE_EXTRA_HEALING:
		reveal_invis = TRUE;
	    if (mtmp->data != &mons[PM_PESTILENCE]) {
		wake = FALSE;		/* wakeup() makes the target angry */
		mtmp->mhp += dice(6, otyp == SPE_EXTRA_HEALING ? 8 : 4);
		if (mtmp->mhp > mtmp->mhpmax)
		    mtmp->mhp = mtmp->mhpmax;
		if (mtmp->mblinded) {
		    mtmp->mblinded = 0;
		    mtmp->mcansee = 1;
		}
		if (canseemon(level, mtmp)) {
		    if (disguised_mimic) {
			if (mtmp->m_ap_type == M_AP_OBJECT &&
			    mtmp->mappearance == STRANGE_OBJECT) {
			    /* it can do better now */
			    set_mimic_sym(mtmp, level);
			    newsym(mtmp->mx, mtmp->my);
			} else
			    mimic_hit_msg(mtmp, otyp);
		    } else pline("%s looks%s better.", Monnam(mtmp),
				 otyp == SPE_EXTRA_HEALING ? " much" : "" );
		}
		if (mtmp->mtame || mtmp->mpeaceful) {
		    adjalign(Role_if (PM_HEALER) ? 1 : sgn(u.ualign.type));
		}
	    } else {	/* Pestilence */
		/* Pestilence will always resist; damage is half of 3d{4,8} */
		resist(mtmp, otmp->oclass,
			      dice(3, otyp == SPE_EXTRA_HEALING ? 8 : 4), TELL);
	    }
		break;
	case WAN_LIGHT:	/* (broken wand) */
		if (flash_hits_mon(mtmp, otmp)) {
		    makeknown(WAN_LIGHT);
		    reveal_invis = TRUE;
		}
		break;
	case WAN_SLEEP:	/* (broken wand) */
		/* [wakeup() doesn't rouse victims of temporary sleep,
		    so it's okay to leave `wake' set to TRUE here] */
		reveal_invis = TRUE;
		if (sleep_monst(mtmp, dice(1 + otmp->spe, 12), WAND_CLASS))
		    slept_monst(mtmp);
		if (!Blind) makeknown(WAN_SLEEP);
		break;
	case SPE_STONE_TO_FLESH:
		if (monsndx(mtmp->data) == PM_STONE_GOLEM) {
		    char *name = Monnam(mtmp);
		    /* turn into flesh golem */
		    if (newcham(level, mtmp, &mons[PM_FLESH_GOLEM], FALSE, FALSE)) {
			if (canseemon(level, mtmp))
			    pline("%s turns to flesh!", name);
		    } else {
			if (canseemon(level, mtmp))
			    pline("%s looks rather fleshy for a moment.",
				  name);
		    }
		} else
		    wake = FALSE;
		break;
	case SPE_DRAIN_LIFE:
		dmg = rnd(8);
		if (dbldam) dmg *= 2;
		if (otyp == SPE_DRAIN_LIFE)
			dmg += spell_damage_bonus();
		if (resists_drli(mtmp))
		    shieldeff(mtmp->mx, mtmp->my);
		else if (!resist(mtmp, otmp->oclass, dmg, NOTELL) &&
				mtmp->mhp > 0) {
		    mtmp->mhp -= dmg;
		    mtmp->mhpmax -= dmg;
		    if (mtmp->mhp <= 0 || mtmp->mhpmax <= 0 || mtmp->m_lev < 1)
			xkilled(mtmp, 1);
		    else {
			mtmp->m_lev--;
			if (canseemon(level, mtmp))
			    pline("%s suddenly seems weaker!", Monnam(mtmp));
		    }
		}
		break;
	default:
		warning("What an interesting effect (%d)", otyp);
		break;
	}
	if (wake) {
	    if (mtmp->mhp > 0) {
		wakeup(mtmp);
		m_respond(mtmp);
		if (mtmp->isshk && !*u.ushops) hot_pursuit(mtmp);
	    } else if (mtmp->m_ap_type)
		seemimic(mtmp); /* might unblock if mimicing a boulder/door */
	}
	/* note: bhitpos won't be set if swallowed, but that's okay since
	 * reveal_invis will be false.  We can't use mtmp->mx, my since it
	 * might be an invisible worm hit on the tail.
	 */
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x, bhitpos.y) &&
							!canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}